

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  TestProperty *this_00;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  TestProperty *in_stack_ffffffffffffffb0;
  TestProperty *in_stack_ffffffffffffffc8;
  UnitTestImpl *in_stack_ffffffffffffffd0;
  
  this_00 = (TestProperty *)&stack0xffffffffffffffa8;
  TestProperty::TestProperty
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  internal::UnitTestImpl::RecordProperty(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TestProperty::~TestProperty(this_00);
  return;
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}